

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O2

void __thiscall fs_tests::fsbridge_stem::test_method(fsbridge_stem *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  char *local_148;
  char *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined1 *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  path local_f8;
  path local_d0;
  path local_a8;
  string local_80;
  string expected_stem;
  string test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_filename,anon_var_dwarf_6f23c0,(allocator<char> *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected_stem,anon_var_dwarf_6f2265,(allocator<char> *)&local_a8);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2c;
  file.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01139f30;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_140 = "";
  fs::PathFromString((path *)&local_f8,&test_filename);
  std::filesystem::__cxx11::path::stem(&local_d0,&local_f8);
  std::filesystem::__cxx11::path::path(&local_a8,&local_d0);
  std::filesystem::__cxx11::path::string(&local_80,&local_a8);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_138,&local_148,0x2c,1,2,&local_80,
             "fs::PathToString(fs::PathFromString(test_filename).stem())",&expected_stem,
             "expected_stem");
  std::__cxx11::string::~string((string *)&local_80);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::__cxx11::string::~string((string *)&expected_stem);
  std::__cxx11::string::~string((string *)&test_filename);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_stem)
{
    std::string test_filename = "fs_tests_₿_🏃.dat";
    std::string expected_stem = "fs_tests_₿_🏃";
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(test_filename).stem()), expected_stem);
}